

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O1

void re2::Parse3CachedPCRE(int iters,char *regexp,StringPiece *text)

{
  bool bVar1;
  int iVar2;
  Arg local_250;
  Arg local_240;
  StringPiece sp3;
  StringPiece sp2;
  StringPiece sp1;
  PCRE re;
  StringPiece *local_1b0;
  code *local_1a8 [47];
  
  PCRE::PCRE(&re,regexp,EnabledCompileOptions);
  iVar2 = std::__cxx11::string::compare((char *)re.error_);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              ((LogMessage *)&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x494,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Check failed: (re.error()) == (\"\")",0x22);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  sp1.ptr_ = (char *)0x0;
  sp1.length_ = 0;
  sp2.ptr_ = (char *)0x0;
  sp2.length_ = 0;
  sp3.ptr_ = (char *)0x0;
  sp3.length_ = 0;
  if (0 < iters) {
    do {
      local_1b0 = &sp1;
      local_1a8[0] = PCRE::Arg::parse_stringpiece;
      local_240.arg_ = &sp2;
      local_240.parser_ = PCRE::Arg::parse_stringpiece;
      local_250.arg_ = &sp3;
      local_250.parser_ = PCRE::Arg::parse_stringpiece;
      bVar1 = PCRE::FullMatchFunctor::operator()
                        ((FullMatchFunctor *)&PCRE::FullMatch,text,&re,(Arg *)&local_1b0,&local_240,
                         &local_250,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args);
      if (!bVar1) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x497,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Check failed: PCRE::FullMatch(text, re, &sp1, &sp2, &sp3)",
                   0x39);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      iters = iters + -1;
    } while (iters != 0);
  }
  PCRE::~PCRE(&re);
  return;
}

Assistant:

void Parse3CachedPCRE(int iters, const char* regexp, const StringPiece& text) {
  PCRE re(regexp, PCRE::UTF8);
  CHECK_EQ(re.error(), "");
  StringPiece sp1, sp2, sp3;
  for (int i = 0; i < iters; i++) {
    CHECK(PCRE::FullMatch(text, re, &sp1, &sp2, &sp3));
  }
}